

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O2

DOMXPathResult * __thiscall
xercesc_4_0::DOMXPathExpressionImpl::evaluate
          (DOMXPathExpressionImpl *this,DOMNode *contextNode,ResultType type,DOMXPathResult *result)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *rawName;
  DOMElement *node;
  undefined4 extraout_var_00;
  DOMException *pDVar2;
  code *pcVar3;
  pointer_____offset_0x10___ *ppuVar4;
  long *plVar5;
  JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> r_cleanup;
  XPathMatcher matcher;
  RefVectorOf<xercesc_4_0::XMLAttr> attrList;
  QName qName;
  SchemaElementDecl elemDecl;
  
  if (type + ~FIRST_ORDERED_NODE_TYPE < 0xfffffffc) {
    pDVar2 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMXPathException::DOMXPathException((DOMXPathException *)pDVar2,0x34,0,this->fMemoryManager);
    ppuVar4 = &DOMXPathException::typeinfo;
    pcVar3 = DOMXPathException::~DOMXPathException;
  }
  else {
    if (contextNode != (DOMNode *)0x0) {
      iVar1 = (*contextNode->_vptr_DOMNode[4])(contextNode);
      if (iVar1 == 1) {
        r_cleanup.fObject = (DOMXPathResultImpl *)0x0;
        r_cleanup.fToCall = 0x71;
        r_cleanup._16_8_ = 0;
        if (result == (DOMXPathResult *)0x0) {
          result = (DOMXPathResult *)XMemory::operator_new(0x28,this->fMemoryManager);
          DOMXPathResultImpl::DOMXPathResultImpl
                    ((DOMXPathResultImpl *)result,type,this->fMemoryManager);
          JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::reset
                    (&r_cleanup,(DOMXPathResultImpl *)result);
        }
        else {
          DOMXPathResultImpl::reset((DOMXPathResultImpl *)result,type);
        }
        XPathMatcher::XPathMatcher(&matcher,this->fParsedExpression,this->fMemoryManager);
        XPathMatcher::startDocumentFragment(&matcher);
        if (this->fMoveToRoot == true) {
          iVar1 = (*contextNode->_vptr_DOMNode[0xc])(contextNode);
          if (CONCAT44(extraout_var,iVar1) == 0) {
            pDVar2 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(pDVar2,9,0,this->fMemoryManager);
            __cxa_throw(pDVar2,&DOMException::typeinfo,DOMException::~DOMException);
          }
          plVar5 = (long *)(CONCAT44(extraout_var,iVar1) + 0x18);
          rawName = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
          QName::QName(&qName,rawName,0,this->fMemoryManager);
          SchemaElementDecl::SchemaElementDecl
                    (&elemDecl,&qName,Any,0xfffffffe,XMLPlatformUtils::fgMemoryManager);
          RefVectorOf<xercesc_4_0::XMLAttr>::RefVectorOf(&attrList,0,true,this->fMemoryManager);
          XPathMatcher::startElement
                    (&matcher,&elemDecl.super_XMLElementDecl,0,L"",&attrList,0,
                     (ValidationContext *)0x0);
          node = (DOMElement *)(**(code **)(*plVar5 + 0x38))(plVar5);
          while (node != (DOMElement *)0x0) {
            iVar1 = (*(node->super_DOMNode)._vptr_DOMNode[4])(node);
            if (iVar1 == 1) {
              testNode(this,&matcher,(DOMXPathResultImpl *)result,node);
            }
            iVar1 = (*(node->super_DOMNode)._vptr_DOMNode[10])(node);
            node = (DOMElement *)CONCAT44(extraout_var_00,iVar1);
          }
          XPathMatcher::endElement
                    (&matcher,&elemDecl.super_XMLElementDecl,L"",(ValidationContext *)0x0,
                     (DatatypeValidator *)0x0);
          RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf(&attrList);
          SchemaElementDecl::~SchemaElementDecl(&elemDecl);
          QName::~QName(&qName);
        }
        else {
          testNode(this,&matcher,(DOMXPathResultImpl *)result,(DOMElement *)contextNode);
        }
        r_cleanup.fObject = (DOMXPathResultImpl *)0x0;
        XPathMatcher::~XPathMatcher(&matcher);
        JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::~JanitorMemFunCall(&r_cleanup);
        return &((DOMXPathResultImpl *)result)->super_DOMXPathResult;
      }
    }
    pDVar2 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(pDVar2,9,0,this->fMemoryManager);
    ppuVar4 = &DOMException::typeinfo;
    pcVar3 = DOMException::~DOMException;
  }
  __cxa_throw(pDVar2,ppuVar4,pcVar3);
}

Assistant:

DOMXPathResult* DOMXPathExpressionImpl::evaluate(const DOMNode *contextNode,
                                                 DOMXPathResult::ResultType type,
                                                 DOMXPathResult* result) const
{
    if(type!=DOMXPathResult::FIRST_ORDERED_NODE_TYPE && type!=DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE &&
       type!=DOMXPathResult::ANY_UNORDERED_NODE_TYPE && type!=DOMXPathResult::UNORDERED_NODE_SNAPSHOT_TYPE)
        throw DOMXPathException(DOMXPathException::TYPE_ERR, 0, fMemoryManager);

    if(contextNode==NULL || contextNode->getNodeType()!=DOMNode::ELEMENT_NODE)
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    JanitorMemFunCall<DOMXPathResultImpl> r_cleanup (
      0, &DOMXPathResultImpl::release);
    DOMXPathResultImpl* r=(DOMXPathResultImpl*)result;
    if(r==NULL)
    {
      r=new (fMemoryManager) DOMXPathResultImpl(type, fMemoryManager);
      r_cleanup.reset (r);
    }
    else
        r->reset(type);

    XPathMatcher matcher(fParsedExpression, fMemoryManager);
    matcher.startDocumentFragment();

    if(fMoveToRoot)
    {
        contextNode=contextNode->getOwnerDocument();
        if(contextNode==NULL)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

        QName qName(contextNode->getNodeName(), 0, fMemoryManager);
        SchemaElementDecl elemDecl(&qName);
        RefVectorOf<XMLAttr> attrList(0, true, fMemoryManager);
        matcher.startElement(elemDecl, 0, XMLUni::fgZeroLenString, attrList, 0);
        DOMNode* child=contextNode->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                testNode(&matcher, r, (DOMElement*)child);
            child=child->getNextSibling();
        }
        matcher.endElement(elemDecl, XMLUni::fgZeroLenString);
    }
    else
        testNode(&matcher, r, (DOMElement*)contextNode);

    r_cleanup.release ();
    return r;
}